

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O2

FILE * wrapped_fopen(char *path,char *mode)

{
  int *piVar1;
  int fd;
  long lVar2;
  code *UNRECOVERED_JUMPTABLE;
  FILE *__stream;
  FILE *pFVar3;
  curious_metadata_record_t io_args;
  
  lVar2 = __tls_get_addr(&PTR_00291758);
  piVar1 = (int *)(lVar2 + 0xc);
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (code *)gotcha_get_wrappee(io_fns[0x16].handle);
  if ((*piVar1 == 1) && (wrappers_enabled != 0)) {
    io_args.mount_point = (char *)0x0;
    io_args.function_id = CURIOUS_FOPEN_ID;
    io_args._28_4_ = 0;
    io_args.call_count = 0;
    io_args._4_4_ = 0;
    io_args.filesystem = (char *)0x0;
    curious_get_filesystem(path,&io_args.filesystem,&io_args.mount_point);
    curious_call_callbacks(4,&io_args);
    __stream = (FILE *)(*UNRECOVERED_JUMPTABLE)(path,mode);
    if (__stream != (FILE *)0x0) {
      fd = fileno(__stream);
      curious_register_file_by_fd(fd);
    }
    curious_call_callbacks(5,&io_args);
    *piVar1 = *piVar1 + -1;
    return (FILE *)__stream;
  }
  *piVar1 = *piVar1 + -1;
  pFVar3 = (FILE *)(*UNRECOVERED_JUMPTABLE)(path,mode);
  return pFVar3;
}

Assistant:

FILE* wrapped_fopen(const char* path, const char* mode)
{
    WRAPPER_ENTER(fopen);

    // Get the handle for the original function
    fopen_f orig_fopen = (fopen_f) gotcha_get_wrappee(io_fns[CURIOUS_FOPEN_ID].handle);

    if (1 == wrapper_call_depth && wrappers_enabled) {
        // NOTE: calling realpath on pathname before passing it to curious_get_filesystem
        //       might be necessary in order to handle relative paths_
        curious_metadata_record_t io_args = {
            .call_count  = 0,
            .function_id = CURIOUS_FOPEN_ID,
        };

        curious_get_filesystem(path, &io_args.filesystem, &io_args.mount_point);
        curious_call_callbacks(CURIOUS_METADATA_CALLBACK, &io_args);

        // Call the original, saving the result...
        FILE* file = orig_fopen(path, mode);

        if (NULL != file) {
            curious_register_file_by_fd(fileno(file));
        }

        curious_call_callbacks(CURIOUS_METADATA_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);
        WRAPPER_RETURN(file, fopen);
    } else {
        WRAPPER_RETURN(orig_fopen(path, mode), fopen);
    }
}